

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerMSL::get_member_location
          (CompilerMSL *this,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  bool bVar1;
  uint32_t uVar2;
  TypeID local_38;
  TypeID local_34;
  TypeID local_30;
  TypeID local_2c;
  uint32_t *local_28;
  uint32_t *comp_local;
  uint32_t index_local;
  uint32_t type_id_local;
  CompilerMSL *this_local;
  
  local_28 = comp;
  comp_local._0_4_ = index;
  comp_local._4_4_ = type_id;
  _index_local = this;
  if (comp != (uint32_t *)0x0) {
    TypedID<(spirv_cross::Types)1>::TypedID(&local_2c,type_id);
    bVar1 = Compiler::has_member_decoration
                      ((Compiler *)this,local_2c,(uint32_t)comp_local,DecorationComponent);
    if (bVar1) {
      TypedID<(spirv_cross::Types)1>::TypedID(&local_30,comp_local._4_4_);
      uVar2 = Compiler::get_member_decoration
                        ((Compiler *)this,local_30,(uint32_t)comp_local,DecorationComponent);
      *local_28 = uVar2;
    }
    else {
      *local_28 = 0xffffffff;
    }
  }
  TypedID<(spirv_cross::Types)1>::TypedID(&local_34,comp_local._4_4_);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)this,local_34,(uint32_t)comp_local,DecorationLocation);
  if (bVar1) {
    TypedID<(spirv_cross::Types)1>::TypedID(&local_38,comp_local._4_4_);
    this_local._4_4_ =
         Compiler::get_member_decoration
                   ((Compiler *)this,local_38,(uint32_t)comp_local,DecorationLocation);
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerMSL::get_member_location(uint32_t type_id, uint32_t index, uint32_t *comp) const
{
	if (comp)
	{
		if (has_member_decoration(type_id, index, DecorationComponent))
			*comp = get_member_decoration(type_id, index, DecorationComponent);
		else
			*comp = k_unknown_component;
	}

	if (has_member_decoration(type_id, index, DecorationLocation))
		return get_member_decoration(type_id, index, DecorationLocation);
	else
		return k_unknown_location;
}